

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O0

bool __thiscall
cmCTestBuildCommand::InitialPass
          (cmCTestBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  reference ppcVar4;
  char *pcVar5;
  string local_3b8 [39];
  allocator local_391;
  string local_390;
  ostringstream local_370 [8];
  ostringstream str_1;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream str;
  bool ret;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestBuildCommand *this_local;
  
  bVar2 = cmCTestHandlerCommand::InitialPass(&this->super_cmCTestHandlerCommand,args,status);
  ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,6);
  if (*ppcVar4 != (value_type)0x0) {
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,6);
    if (**ppcVar4 != '\0') {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      iVar3 = cmCTestBuildHandler::GetTotalErrors(this->Handler);
      std::ostream::operator<<(local_1a0,iVar3);
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,6);
      pcVar5 = *ppcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d0,pcVar5,&local_1d1);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_1d0,pcVar5);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
    }
  }
  ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,7);
  if (*ppcVar4 != (value_type)0x0) {
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,7);
    if (**ppcVar4 != '\0') {
      std::__cxx11::ostringstream::ostringstream(local_370);
      iVar3 = cmCTestBuildHandler::GetTotalWarnings(this->Handler);
      std::ostream::operator<<(local_370,iVar3);
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,7);
      pcVar5 = *ppcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_390,pcVar5,&local_391);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_390,pcVar5);
      std::__cxx11::string::~string(local_3b8);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      std::__cxx11::ostringstream::~ostringstream(local_370);
    }
  }
  return bVar2;
}

Assistant:

bool cmCTestBuildCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus &status)
{
  bool ret =  cmCTestHandlerCommand::InitialPass(args, status);
  if ( this->Values[ctb_NUMBER_ERRORS] && *this->Values[ctb_NUMBER_ERRORS])
    {
    std::ostringstream str;
    str << this->Handler->GetTotalErrors();
    this->Makefile->AddDefinition(
      this->Values[ctb_NUMBER_ERRORS], str.str().c_str());
    }
  if ( this->Values[ctb_NUMBER_WARNINGS]
       && *this->Values[ctb_NUMBER_WARNINGS])
    {
    std::ostringstream str;
    str << this->Handler->GetTotalWarnings();
    this->Makefile->AddDefinition(
      this->Values[ctb_NUMBER_WARNINGS], str.str().c_str());
    }
  return ret;
}